

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

void __thiscall
embree::CoronaLoader::loadMaterialDefinition(CoronaLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  bool bVar1;
  mapped_type *pmVar2;
  runtime_error *prVar3;
  undefined1 local_80 [32];
  string name;
  string local_40;
  
  bVar1 = std::operator!=(&xml->ptr->name,"materialDefinition");
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_40,&xml->ptr->loc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &local_40,": invalid material definition: ");
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,&xml->ptr->name);
    std::runtime_error::runtime_error(prVar3,(string *)&name);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = xml->ptr;
  if ((long)(this_00->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this_00->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    std::__cxx11::string::string((string *)local_80,"name",(allocator *)&local_40);
    XML::parm(&name,this_00,(string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
    loadMaterial((CoronaLoader *)local_80,(Ref<embree::XML> *)this);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
             ::operator[](&this->materialMap,&name);
    if (pmVar2->ptr != (MaterialNode *)0x0) {
      (*(pmVar2->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
    }
    pmVar2->ptr = (MaterialNode *)local_80._0_8_;
    std::__cxx11::string::~string((string *)&name);
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_((string *)local_80,&xml->ptr->loc);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                 ,": invalid material definition");
  std::runtime_error::runtime_error(prVar3,(string *)&name);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoronaLoader::loadMaterialDefinition(const Ref<XML>& xml) 
  {
    if (xml->name != "materialDefinition") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material definition: "+xml->name);
    if (xml->children.size() != 1) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material definition");

    const std::string name = xml->parm("name");
    materialMap[name] = loadMaterial(xml->children[0]);
  }